

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPFForceManager.cpp
# Opt level: O1

void __thiscall OpenMD::RNEMD::SPFForceManager::updateShortRangePotentials(SPFForceManager *this)

{
  RealType RVar1;
  RealType RVar2;
  double dVar3;
  
  RVar1 = Snapshot::getBondPotential(this->temporarySourceSnapshot_);
  RVar2 = Snapshot::getBondPotential(this->temporarySinkSnapshot_);
  dVar3 = linearCombination<double>(this,RVar1,RVar2);
  Snapshot::setBondPotential(this->currentSnapshot_,dVar3);
  RVar1 = Snapshot::getBendPotential(this->temporarySourceSnapshot_);
  RVar2 = Snapshot::getBendPotential(this->temporarySinkSnapshot_);
  dVar3 = linearCombination<double>(this,RVar1,RVar2);
  Snapshot::setBendPotential(this->currentSnapshot_,dVar3);
  RVar1 = Snapshot::getTorsionPotential(this->temporarySourceSnapshot_);
  RVar2 = Snapshot::getTorsionPotential(this->temporarySinkSnapshot_);
  dVar3 = linearCombination<double>(this,RVar1,RVar2);
  Snapshot::setTorsionPotential(this->currentSnapshot_,dVar3);
  RVar1 = Snapshot::getInversionPotential(this->temporarySourceSnapshot_);
  RVar2 = Snapshot::getInversionPotential(this->temporarySinkSnapshot_);
  dVar3 = linearCombination<double>(this,RVar1,RVar2);
  Snapshot::setInversionPotential(this->currentSnapshot_,dVar3);
  return;
}

Assistant:

void SPFForceManager::updateShortRangePotentials() {
    RealType bondPotential =
        linearCombination(temporarySourceSnapshot_->getBondPotential(),
                          temporarySinkSnapshot_->getBondPotential());
    currentSnapshot_->setBondPotential(bondPotential);

    RealType bendPotential =
        linearCombination(temporarySourceSnapshot_->getBendPotential(),
                          temporarySinkSnapshot_->getBendPotential());
    currentSnapshot_->setBendPotential(bendPotential);

    RealType torsionPotential =
        linearCombination(temporarySourceSnapshot_->getTorsionPotential(),
                          temporarySinkSnapshot_->getTorsionPotential());
    currentSnapshot_->setTorsionPotential(torsionPotential);

    RealType inversionPotential =
        linearCombination(temporarySourceSnapshot_->getInversionPotential(),
                          temporarySinkSnapshot_->getInversionPotential());
    currentSnapshot_->setInversionPotential(inversionPotential);
  }